

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::NnPredictTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::NnPredictTest_DISABLED_Speed_Test> *this)

{
  NnPredictTest *this_00;
  
  WithParamInterface<std::tuple<void(*const)(float_const*,NN_CONFIG_const*,int,float*)>>::parameter_
       = &this->parameter_;
  this_00 = (NnPredictTest *)operator_new(0xe8);
  anon_unknown.dwarf_1664447::NnPredictTest::NnPredictTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<void_(*const)(const_float_*,_const_NN_CONFIG_*,_int,_float_*)>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f41780;
  (this_00->
  super_TestWithParam<std::tuple<void_(*const)(const_float_*,_const_NN_CONFIG_*,_int,_float_*)>_>).
  super_WithParamInterface<std::tuple<void_(*const)(const_float_*,_const_NN_CONFIG_*,_int,_float_*)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__NnPredictTest_DISABLED_Speed_Test_00f417c0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }